

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<float> fmt::v11::detail::dragonbox::to_decimal<float>(float x)

{
  compute_mul_parity_result cVar1;
  int iVar2;
  compute_mul_result cVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  cache_entry_type cache;
  
  uVar11 = (uint)x & 0x7fffff;
  uVar10 = (uint)x >> 0x17 & 0xff;
  if (uVar10 == 0) {
    uVar10 = 0xffffff6b;
    if (uVar11 == 0) {
      uVar15 = 0;
      uVar8 = 0;
      goto LAB_003196a1;
    }
LAB_0031948e:
    uVar14 = (int)(uVar10 * 0x4d105) >> 0x14;
    uVar15 = (ulong)uVar14;
    cache = *(cache_entry_type *)
             (cache_accessor<float>::get_cached_power(int)::pow10_significands +
             (ulong)(0x20 - uVar14) * 8);
    iVar5 = ((int)((1 - uVar14) * 0x1a934f) >> 0x13) + uVar10;
    uVar13 = cache >> (~(byte)iVar5 & 0x3f);
    cVar3 = cache_accessor<float>::compute_mul(uVar11 * 2 + 1 << ((byte)iVar5 & 0x1f),&cache);
    uVar8 = ((ulong)cVar3 & 0xffffffff) / 100;
    iVar6 = (int)uVar8;
    iVar2 = (int)(((ulong)cVar3 & 0xffffffff) / 100);
    uVar10 = iVar2 * -100 + cVar3.result;
    uVar7 = (uint)uVar13;
    if (uVar10 < uVar7) {
      if ((uVar10 != 0) || ((uVar11 & 1 & cVar3._4_4_) == 0)) {
LAB_00319547:
        iVar5 = uVar14 - 1;
        do {
          uVar15 = uVar8;
          iVar2 = (int)uVar15;
          uVar10 = iVar2 * 0x40000000 | (uint)(iVar2 * -0x3d70a3d7) >> 2;
          iVar5 = iVar5 + 2;
          uVar8 = (ulong)uVar10;
        } while (uVar10 < 0x28f5c29);
        uVar10 = (uint)(iVar2 * -0x33333333) >> 1 | (uint)((iVar2 * -0x33333333 & 1U) != 0) << 0x1f;
        bVar16 = uVar10 < 0x1999999a;
        uVar8 = (ulong)uVar10;
        if (!bVar16) {
          uVar8 = uVar15;
        }
        goto LAB_0031969d;
      }
      iVar6 = iVar2 + -1;
      uVar10 = 100;
    }
    else if ((uVar10 <= uVar7) &&
            (cVar1 = cache_accessor<float>::compute_mul_parity(uVar11 * 2 - 1,&cache,iVar5),
            (~uVar11 & (uint)((ushort)cVar1 >> 8) & 1) != 0 || ((ushort)cVar1 & 1) != 0))
    goto LAB_00319547;
    uVar10 = uVar10 - (uVar7 >> 1);
    uVar7 = uVar10 * 0x199a + 0x8002;
    uVar14 = uVar7 >> 0x10;
    uVar12 = iVar6 * 10 + uVar14;
    uVar8 = (ulong)uVar12;
    if ((uVar7 & 0xffff) < 0x199a) {
      cVar1 = cache_accessor<float>::compute_mul_parity(uVar11 * 2,&cache,iVar5);
      if ((uVar10 & 1) == ((ushort)cVar1 & 1)) {
        uVar8 = (ulong)(uVar12 - (uVar14 & (ushort)cVar1 >> 8 & 1));
      }
      else {
        uVar8 = (ulong)(uVar12 - 1);
      }
    }
  }
  else {
    uVar10 = uVar10 - 0x96;
    if (uVar11 != 0) {
      uVar11 = uVar11 | 0x800000;
      goto LAB_0031948e;
    }
    uVar7 = (int)(uVar10 * 0x9a209 + -0x3fe1f) >> 0x15;
    uVar15 = (ulong)uVar7;
    cVar9 = (char)((int)(uVar7 * -0x1a934f) >> 0x13) + (char)uVar10;
    uVar8 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x1f - uVar7) * 8);
    bVar4 = 0x28 - cVar9;
    uVar11 = (uint)((uVar10 & 0xfffffffe) != 2) + (int)(uVar8 - (uVar8 >> 0x19) >> (bVar4 & 0x3f));
    uVar13 = ((uVar8 >> 0x18) + uVar8 >> (bVar4 & 0x3f) & 0xffffffff) / 10;
    if ((uint)((int)uVar13 * 10) < uVar11) {
      uVar7 = (int)(uVar8 >> (0x27U - cVar9 & 0x3f)) + 1U >> 1;
      if (uVar10 == 0xffffffdd) {
        uVar8 = (ulong)(uVar7 & 0xfffffffe);
      }
      else {
        uVar8 = (ulong)(uVar7 + (uVar7 < uVar11));
      }
      goto LAB_003196a1;
    }
    iVar5 = uVar7 - 1;
    do {
      uVar15 = uVar13;
      iVar2 = (int)uVar15;
      uVar10 = iVar2 * 0x40000000 | (uint)(iVar2 * -0x3d70a3d7) >> 2;
      iVar5 = iVar5 + 2;
      uVar13 = (ulong)uVar10;
    } while (uVar10 < 0x28f5c29);
    uVar10 = (uint)(iVar2 * -0x33333333) >> 1 | (uint)((iVar2 * -0x33333333 & 1U) != 0) << 0x1f;
    bVar16 = uVar10 < 0x1999999a;
    uVar8 = (ulong)uVar10;
    if (!bVar16) {
      uVar8 = uVar15;
    }
LAB_0031969d:
    uVar15 = (ulong)(iVar5 + (uint)bVar16);
  }
LAB_003196a1:
  return (decimal_fp<float>)(uVar8 | uVar15 << 0x20);
}

Assistant:

auto small_division_by_pow10(uint32_t n) noexcept -> uint32_t {
  constexpr auto info = div_small_pow10_infos[N - 1];
  FMT_ASSERT(n <= info.divisor * 10, "n is too large");
  constexpr uint32_t magic_number =
      (1u << info.shift_amount) / info.divisor + 1;
  return (n * magic_number) >> info.shift_amount;
}